

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Inst * Inst::unifyVariable(Inst *__return_storage_ptr__,Register r)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<Arg> __l;
  Arg local_50;
  allocator_type local_19;
  
  paVar1 = &local_50.f_.id.field_2;
  local_50.f_.id.field_2._M_allocated_capacity._0_4_ = 0x62726167;
  local_50.f_.id._M_string_length = 7;
  local_50.f_.id.field_2._M_allocated_capacity._4_4_ = 0x656761;
  local_50.f_.arity = -0x2a;
  local_50.tag = Register;
  __return_storage_ptr__->tag_ = UnifyVariable;
  __l._M_len = 1;
  __l._M_array = &local_50;
  local_50.f_.id._M_dataplus._M_p = (pointer)paVar1;
  local_50.r_.r = r.r;
  std::vector<Arg,_std::allocator<Arg>_>::vector(&__return_storage_ptr__->args,__l,&local_19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.f_.id._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.f_.id._M_dataplus._M_p,
                    CONCAT44(local_50.f_.id.field_2._M_allocated_capacity._4_4_,
                             local_50.f_.id.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Inst unifyVariable(Register r) {
    return Inst(InstTag::UnifyVariable, {r});
    }